

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O2

void duckdb::MapConcatFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  long lVar3;
  long lVar4;
  pointer pMVar5;
  pointer pVVar6;
  bool bVar7;
  bool bVar8;
  size_type __n;
  reference pvVar9;
  reference pvVar10;
  Vector *pVVar11;
  __normal_iterator<duckdb::Value_*,_std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>_>
  _Var12;
  long lVar13;
  ulong uVar14;
  pointer pMVar15;
  pointer pMVar16;
  idx_t iVar17;
  idx_t iVar18;
  Value *list_entry;
  pointer pMVar19;
  pointer insert;
  ulong uVar20;
  long lVar21;
  pointer pMVar22;
  ulong uVar23;
  idx_t i;
  size_type sVar24;
  vector<duckdb::Value,_true> keys_list;
  vector<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
  local_138;
  idx_t local_120;
  idx_t local_118;
  pointer local_110;
  vector<duckdb::Value,_true> values_list;
  vector<duckdb::Value,_true> list_entries;
  pointer local_78;
  pointer pVStack_70;
  pointer local_68;
  vector<duckdb::UnifiedVectorFormat,_true> map_formats;
  pointer local_48;
  pointer pVStack_40;
  pointer local_38;
  
  if ((result->type).id_ == SQLNULL) {
    FlatVector::VerifyFlatVector(result);
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,0);
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    return;
  }
  local_120 = args->count;
  __n = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x68;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
            (&map_formats.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             ,__n,(allocator_type *)&list_entries);
  for (sVar24 = 0; __n != sVar24; sVar24 = sVar24 + 1) {
    pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar24);
    pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)
                         &map_formats.
                          super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
                         ,sVar24);
    Vector::ToUnifiedFormat(pvVar9,local_120,pvVar10);
  }
  pdVar1 = result->data;
  iVar18 = 0;
  do {
    if (iVar18 == local_120) {
      bVar8 = DataChunk::AllConstant(args);
      if (bVar8) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      Vector::Verify(result,local_120);
      ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
      ~vector(&map_formats.
               super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             );
      return;
    }
    local_138.
    super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar8 = true;
    local_110 = (pointer)0x0;
    pMVar22 = (pointer)0x0;
    pMVar19 = (pointer)0x0;
    local_118 = iVar18;
    for (sVar24 = 0; sVar24 != __n; sVar24 = sVar24 + 1) {
      pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar24);
      if ((pvVar9->type).id_ != SQLNULL) {
        pvVar10 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&map_formats,sVar24);
        psVar2 = pvVar10->sel->sel_vector;
        iVar17 = local_118;
        if (psVar2 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar2[local_118];
        }
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&(pvVar10->validity).super_TemplatedValidityMask<unsigned_long>,iVar17);
        if (bVar7) {
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,sVar24);
          pVVar11 = MapVector::GetKeys(pvVar9);
          lVar3 = *(long *)(pvVar10->data + iVar17 * 0x10);
          lVar4 = *(long *)(pvVar10->data + iVar17 * 0x10 + 8);
          for (lVar21 = 0; lVar21 != lVar4; lVar21 = lVar21 + 1) {
            iVar17 = lVar21 + lVar3;
            Vector::GetValue((Value *)&list_entries,pVVar11,iVar17);
            _Var12 = ::std::
                     __find_if<__gnu_cxx::__normal_iterator<duckdb::Value*,std::vector<duckdb::Value,std::allocator<duckdb::Value>>>,__gnu_cxx::__ops::_Iter_equals_val<duckdb::Value_const>>
                               (keys_list.
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                keys_list.
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_finish,(Value *)&list_entries);
            if (_Var12._M_current ==
                keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&keys_list,
                         (value_type *)&list_entries);
              if (local_138.
                  super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                  ._M_impl.super__Vector_impl_data._M_finish == local_110) {
                if ((long)local_110 - (long)pMVar19 == 0x7ffffffffffffff0) {
                  local_138.
                  super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                  ._M_impl.super__Vector_impl_data._M_start = pMVar19;
                  ::std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar23 = (long)local_110 - (long)pMVar19 >> 4;
                uVar14 = uVar23;
                if (local_110 == pMVar19) {
                  uVar14 = 1;
                }
                uVar20 = uVar14 + uVar23;
                if (0x7fffffffffffffe < uVar20) {
                  uVar20 = 0x7ffffffffffffff;
                }
                if (CARRY8(uVar14,uVar23)) {
                  uVar20 = 0x7ffffffffffffff;
                }
                if (uVar20 == 0) {
                  pMVar15 = (pointer)0x0;
                }
                else {
                  pMVar15 = (pointer)operator_new(uVar20 << 4);
                }
                pMVar15[uVar23].map_index = sVar24;
                pMVar15[uVar23].key_index = iVar17;
                pMVar5 = pMVar15;
                for (pMVar16 = pMVar19; pMVar22 = pMVar5 + 1, pMVar16 != local_110;
                    pMVar16 = pMVar16 + 1) {
                  iVar17 = pMVar16->key_index;
                  pMVar5->map_index = pMVar16->map_index;
                  pMVar5->key_index = iVar17;
                  pMVar5 = pMVar22;
                }
                if (pMVar19 != (pointer)0x0) {
                  operator_delete(pMVar19);
                }
                local_138.
                super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar15 + uVar20;
                pMVar19 = pMVar15;
                local_138.
                super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                ._M_impl.super__Vector_impl_data._M_finish = pMVar22;
                local_110 = local_138.
                            super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              else {
                (local_138.
                 super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->map_index = sVar24;
                (local_138.
                 super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->key_index = iVar17;
                pMVar22 = local_138.
                          super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1;
                local_138.
                super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
                ._M_impl.super__Vector_impl_data._M_finish = pMVar22;
              }
            }
            else {
              lVar13 = (long)_Var12._M_current -
                       (long)keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2;
              *(idx_t *)((long)&pMVar19->key_index + lVar13) = iVar17;
              *(size_type *)((long)&pMVar19->map_index + lVar13) = sVar24;
            }
            Value::~Value((Value *)&list_entries);
          }
          bVar8 = false;
          local_138.
          super__Vector_base<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
          ._M_impl.super__Vector_impl_data._M_start = pMVar19;
        }
      }
    }
    iVar17 = ListVector::GetListSize(result);
    *(idx_t *)(pdVar1 + iVar18 * 0x10) = iVar17;
    *(long *)((long)(pdVar1 + iVar18 * 0x10) + 8) =
         (long)keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start >> 6;
    if (bVar8) {
      FlatVector::SetNull(result,local_118,true);
    }
    else {
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (; pMVar19 != pMVar22; pMVar19 = pMVar19 + 1) {
        pvVar9 = vector<duckdb::Vector,_true>::get<true>(&args->data,pMVar19->map_index);
        pVVar11 = MapVector::GetValues(pvVar9);
        Vector::GetValue((Value *)&list_entries,pVVar11,pMVar19->key_index);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values_list,
                   (Value *)&list_entries);
        Value::~Value((Value *)&list_entries);
      }
      local_48 = keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pVStack_40 = keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_38 = keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      keys_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78 = values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pVStack_70 = values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_68 = values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values_list.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetListEntries(&list_entries,(vector<duckdb::Value,_true> *)&local_48,
                     (vector<duckdb::Value,_true> *)&local_78);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
      pVVar6 = list_entries.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (insert = list_entries.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start; insert != pVVar6; insert = insert + 1) {
        ListVector::PushBack(result,insert);
      }
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&list_entries);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values_list);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&keys_list);
    ::std::
    vector<duckdb::(anonymous_namespace)::MapKeyIndexPair,_std::allocator<duckdb::(anonymous_namespace)::MapKeyIndexPair>_>
    ::~vector(&local_138);
    iVar18 = local_118 + 1;
  } while( true );
}

Assistant:

static void MapConcatFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (result.GetType().id() == LogicalTypeId::SQLNULL) {
		// All inputs are NULL, just return NULL
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);
	auto count = args.size();

	auto map_count = args.ColumnCount();
	vector<UnifiedVectorFormat> map_formats(map_count);
	for (idx_t i = 0; i < map_count; i++) {
		auto &map = args.data[i];
		map.ToUnifiedFormat(count, map_formats[i]);
	}
	auto result_data = FlatVector::GetData<list_entry_t>(result);

	for (idx_t i = 0; i < count; i++) {
		// Loop through all the maps per list
		// we cant do better because all the entries of the child vector have to be contiguous
		// so we cant start the next row before we have finished the one before it
		auto &result_entry = result_data[i];
		vector<MapKeyIndexPair> index_to_map;
		vector<Value> keys_list;
		bool all_null = true;
		for (idx_t map_idx = 0; map_idx < map_count; map_idx++) {
			if (args.data[map_idx].GetType().id() == LogicalTypeId::SQLNULL) {
				continue;
			}

			auto &map_format = map_formats[map_idx];
			auto index = map_format.sel->get_index(i);
			if (!map_format.validity.RowIsValid(index)) {
				continue;
			}

			all_null = false;
			auto &keys = MapVector::GetKeys(args.data[map_idx]);
			auto entry = UnifiedVectorFormat::GetData<list_entry_t>(map_format)[index];

			// Update the list for this row
			for (idx_t list_idx = 0; list_idx < entry.length; list_idx++) {
				auto key_index = entry.offset + list_idx;
				auto key = keys.GetValue(key_index);
				auto entry = std::find(keys_list.begin(), keys_list.end(), key);
				if (entry == keys_list.end()) {
					// Result list does not contain this value yet
					keys_list.push_back(key);
					index_to_map.emplace_back(map_idx, key_index);
				} else {
					// Result list already contains this, update where to find the value at
					auto distance = std::distance(keys_list.begin(), entry);
					auto &mapping = *(index_to_map.begin() + distance);
					mapping.key_index = key_index;
					mapping.map_index = map_idx;
				}
			}
		}

		result_entry.offset = ListVector::GetListSize(result);
		result_entry.length = keys_list.size();
		if (all_null) {
			D_ASSERT(keys_list.empty() && index_to_map.empty());
			FlatVector::SetNull(result, i, true);
			continue;
		}

		vector<Value> values_list;
		D_ASSERT(keys_list.size() == index_to_map.size());
		// Get the values from the mapping
		for (auto &mapping : index_to_map) {
			auto &map = args.data[mapping.map_index];
			auto &values = MapVector::GetValues(map);
			values_list.push_back(values.GetValue(mapping.key_index));
		}
		D_ASSERT(values_list.size() == keys_list.size());
		auto list_entries = GetListEntries(std::move(keys_list), std::move(values_list));
		for (auto &list_entry : list_entries) {
			ListVector::PushBack(result, list_entry);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(count);
}